

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcFragDepthTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::FragDepthCompareCase::iterate(FragDepthCompareCase *this)

{
  void **__return_storage_ptr__;
  code *pcVar1;
  code *pcVar2;
  EvalFragDepthFunc p_Var3;
  undefined *puVar4;
  bool bVar5;
  deUint32 dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  TestLog *log_00;
  RenderContext *pRVar13;
  deUint32 extraout_var;
  char *pcVar14;
  undefined4 extraout_var_00;
  NotSupportedError *this_01;
  TestError *pTVar15;
  float fVar16;
  float fVar17;
  char *local_b88;
  VertexArrayBinding *local_aa0;
  RGBA local_8dc;
  bool isOk;
  bool dpass_1;
  float local_8cc;
  float local_8c8;
  float d_1;
  float rd;
  float xh;
  float xf_1;
  int x_1;
  bool dpass;
  float local_8a8;
  float local_8a4;
  float d;
  float xf;
  int x;
  int half;
  float yf;
  int y;
  PrimitiveList local_868;
  undefined1 local_84a;
  allocator<char> local_849;
  string local_848;
  allocator<char> local_821;
  string local_820;
  void **local_800;
  undefined1 local_7f8 [8];
  VertexArrayBinding vertexArrays [2];
  float position [16];
  float coord [8];
  string local_6f0;
  string local_6d0;
  allocator<char> local_6aa;
  allocator<char> local_6a9;
  string local_6a8;
  string local_688;
  string local_668;
  ProgramSources local_648;
  undefined1 local_578 [8];
  ShaderProgram program;
  allocator<char> local_489;
  string local_488;
  undefined1 local_468 [8];
  VertexArrayBinding posBinding_1;
  allocator<char> local_3f9;
  string local_3f8;
  undefined1 local_3d8 [8];
  VertexArrayBinding posBinding;
  float varyingDepthCoord [16];
  float constDepthCoord [16];
  allocator<char> local_2fa;
  allocator<char> local_2f9;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  allocator<char> local_292;
  allocator<char> local_291;
  string local_290;
  string local_270;
  string local_250;
  ProgramSources local_230;
  undefined1 local_160 [8];
  ShaderProgram basicQuadProgram;
  undefined1 local_88 [4];
  float constDepth;
  Surface referenceFrame;
  Surface renderedFrame;
  int viewportY;
  int viewportX;
  int viewportH;
  int viewportW;
  RenderTarget *renderTarget;
  Random rnd;
  Functions *gl;
  TestLog *log;
  FragDepthCompareCase *this_local;
  RenderTarget *this_00;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  rnd.m_rnd.z = (*pRVar13->_vptr_RenderContext[3])();
  rnd.m_rnd.w = extraout_var;
  pcVar14 = tcu::TestNode::getName((TestNode *)this);
  dVar6 = deStringHash(pcVar14);
  de::Random::Random((Random *)&renderTarget,dVar6);
  pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar7 = (*pRVar13->_vptr_RenderContext[4])();
  this_00 = (RenderTarget *)CONCAT44(extraout_var_00,iVar7);
  iVar7 = tcu::RenderTarget::getWidth(this_00);
  iVar7 = de::min<int>(0x80,iVar7);
  iVar8 = tcu::RenderTarget::getHeight(this_00);
  iVar8 = de::min<int>(0x80,iVar8);
  iVar9 = tcu::RenderTarget::getWidth(this_00);
  iVar9 = de::Random::getInt((Random *)&renderTarget,0,iVar9 - iVar7);
  iVar10 = tcu::RenderTarget::getHeight(this_00);
  iVar10 = de::Random::getInt((Random *)&renderTarget,0,iVar10 - iVar8);
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,iVar7,iVar8);
  tcu::Surface::Surface((Surface *)local_88,iVar7,iVar8);
  basicQuadProgram.m_program.m_info.linkTimeUs._4_4_ = 0x3dcccccd;
  iVar11 = tcu::RenderTarget::getDepthBits(this_00);
  if (iVar11 == 0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Depth buffer is required","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcFragDepthTests.cpp"
               ,0x9b);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  (**(code **)(rnd.m_rnd._8_8_ + 0x1a00))(iVar9,iVar10,iVar7,iVar8);
  (**(code **)(rnd.m_rnd._8_8_ + 0x188))(0x4500);
  (**(code **)(rnd.m_rnd._8_8_ + 0x5e0))(0xb71);
  pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  puVar4 = s_vertexShaderSrc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,puVar4,&local_291);
  specializeVersion(&local_270,&local_290,this->m_glslVersion);
  pcVar14 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,pcVar14,&local_292);
  puVar4 = s_defaultFragmentShaderSrc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,puVar4,&local_2f9);
  specializeVersion(&local_2d8,&local_2f8,this->m_glslVersion);
  pcVar14 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,pcVar14,&local_2fa);
  glu::makeVtxFragSources(&local_230,&local_250,&local_2b8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_160,pRVar13,&local_230);
  glu::ProgramSources::~ProgramSources(&local_230);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2fa);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_292);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_160);
  if (!bVar5) {
    glu::operator<<(log_00,(ShaderProgram *)local_160);
    pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar15,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcFragDepthTests.cpp"
               ,0xad);
    __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  varyingDepthCoord[0xe] = -1.0;
  varyingDepthCoord[0xf] = -1.0;
  varyingDepthCoord[10] = 1.0;
  varyingDepthCoord[0xb] = 1.0;
  varyingDepthCoord[0xc] = -1.0;
  varyingDepthCoord[0xd] = 1.0;
  varyingDepthCoord[6] = 1.0;
  varyingDepthCoord[7] = -1.0;
  varyingDepthCoord[8] = 0.0;
  varyingDepthCoord[9] = 1.0;
  varyingDepthCoord[2] = 0.0;
  varyingDepthCoord[3] = 1.0;
  varyingDepthCoord[4] = 0.0;
  varyingDepthCoord[5] = 1.0;
  posBinding.pointer.data = (void *)0xbf80000000000000;
  varyingDepthCoord[0] = 1.0;
  varyingDepthCoord[1] = 1.0;
  pcVar1 = *(code **)(rnd.m_rnd._8_8_ + 0x1680);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_160);
  (*pcVar1)(dVar6);
  pcVar1 = *(code **)(rnd.m_rnd._8_8_ + 0x15a0);
  pcVar2 = *(code **)(rnd.m_rnd._8_8_ + 0xb48);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_160);
  uVar12 = (*pcVar2)(dVar6,"u_color");
  (*pcVar1)(0,0,0x3f800000,uVar12);
  (**(code **)(rnd.m_rnd._8_8_ + 0x4a0))(0x207);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"a_position",&local_3f9);
  glu::va::Float((VertexArrayBinding *)local_3d8,&local_3f8,4,4,0,varyingDepthCoord + 0xe);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_160);
  glu::pr::Triangles((PrimitiveList *)&posBinding_1.pointer.data,6,iterate::quadIndices);
  glu::draw(pRVar13,dVar6,1,(VertexArrayBinding *)local_3d8,
            (PrimitiveList *)&posBinding_1.pointer.data,(DrawUtilCallback *)0x0);
  glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"a_position",&local_489);
  glu::va::Float((VertexArrayBinding *)local_468,&local_488,4,4,0,(float *)&posBinding.pointer.data)
  ;
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_160);
  glu::pr::Triangles((PrimitiveList *)&program.m_program.m_info.linkTimeUs,6,iterate::quadIndices);
  glu::draw(pRVar13,dVar6,1,(VertexArrayBinding *)local_468,
            (PrimitiveList *)&program.m_program.m_info.linkTimeUs,(DrawUtilCallback *)0x0);
  glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_468);
  dVar6 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar6,"Draw base quads",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcFragDepthTests.cpp"
                  ,0xc5);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_160);
  pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  puVar4 = s_vertexShaderSrc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,puVar4,&local_6a9);
  specializeVersion(&local_688,&local_6a8,this->m_glslVersion);
  pcVar14 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,pcVar14,&local_6aa);
  specializeVersion(&local_6f0,&this->m_fragSrc,this->m_glslVersion);
  pcVar14 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d0,pcVar14,(allocator<char> *)((long)coord + 0x1f));
  glu::makeVtxFragSources(&local_648,&local_668,&local_6d0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_578,pRVar13,&local_648);
  glu::ProgramSources::~ProgramSources(&local_648);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)coord + 0x1f));
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator(&local_6aa);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  glu::operator<<(log_00,(ShaderProgram *)local_578);
  bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_578);
  if (!bVar5) {
    pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar15,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcFragDepthTests.cpp"
               ,0xd0);
    __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  coord[2] = 1.0;
  coord[3] = 0.0;
  coord[4] = 1.0;
  coord[5] = 1.0;
  position[0xe] = 0.0;
  position[0xf] = 0.0;
  coord[0] = 0.0;
  coord[1] = 1.0;
  position[10] = 1.0;
  position[0xb] = 1.0;
  position[0xc] = -1.0;
  position[0xd] = 1.0;
  position[6] = 1.0;
  position[7] = -1.0;
  position[8] = 0.0;
  position[9] = 1.0;
  position[2] = -1.0;
  position[3] = 1.0;
  position[4] = 0.0;
  position[5] = 1.0;
  vertexArrays[1].pointer.data = (void *)0xbf800000bf800000;
  position[0] = 1.0;
  position[1] = 1.0;
  pcVar1 = *(code **)(rnd.m_rnd._8_8_ + 0x1680);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_578);
  (*pcVar1)(dVar6);
  (**(code **)(rnd.m_rnd._8_8_ + 0x4a0))(this->m_compareFunc);
  pcVar1 = *(code **)(rnd.m_rnd._8_8_ + 0x15a0);
  pcVar2 = *(code **)(rnd.m_rnd._8_8_ + 0xb48);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_578);
  uVar12 = (*pcVar2)(dVar6,"u_color");
  (*pcVar1)(0,0x3f800000,uVar12);
  pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_578);
  setupDefaultUniforms(pRVar13,dVar6);
  local_84a = 1;
  local_800 = (void **)local_7f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_820,"a_position",&local_821);
  glu::va::Float((VertexArrayBinding *)local_7f8,&local_820,4,4,0,
                 (float *)&vertexArrays[1].pointer.data);
  __return_storage_ptr__ = &vertexArrays[0].pointer.data;
  local_800 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_848,"a_coord",&local_849);
  glu::va::Float((VertexArrayBinding *)__return_storage_ptr__,&local_848,2,4,0,position + 0xe);
  local_84a = 0;
  std::__cxx11::string::~string((string *)&local_848);
  std::allocator<char>::~allocator(&local_849);
  std::__cxx11::string::~string((string *)&local_820);
  std::allocator<char>::~allocator(&local_821);
  pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_578);
  glu::pr::Triangles(&local_868,6,iterate::quadIndices);
  glu::draw(pRVar13,dVar6,2,(VertexArrayBinding *)local_7f8,&local_868,(DrawUtilCallback *)0x0);
  local_aa0 = (VertexArrayBinding *)&vertexArrays[1].pointer.data;
  do {
    local_aa0 = local_aa0 + -1;
    glu::VertexArrayBinding::~VertexArrayBinding(local_aa0);
  } while (local_aa0 != (VertexArrayBinding *)local_7f8);
  dVar6 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar6,"Draw test quad",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcFragDepthTests.cpp"
                  ,0xe4);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_578);
  pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&yf,(Surface *)&referenceFrame.m_pixels.m_cap);
  glu::readPixels(pRVar13,iVar9,iVar10,(PixelBufferAccess *)&yf);
  for (half = 0; iVar7 = half, iVar8 = tcu::Surface::getHeight((Surface *)local_88), iVar7 < iVar8;
      half = half + 1) {
    fVar16 = (float)half;
    iVar7 = tcu::Surface::getHeight((Surface *)local_88);
    x = (int)((fVar16 + 0.5) / (float)iVar7);
    iVar7 = tcu::Surface::getWidth((Surface *)local_88);
    iVar8 = tcu::Surface::getWidth((Surface *)local_88);
    xf = (float)de::clamp<int>((int)((float)iVar7 * 0.5 + 0.5),0,iVar8);
    for (d = 0.0; (int)d < (int)xf; d = (float)((int)d + 1)) {
      fVar16 = (float)(int)d;
      iVar7 = tcu::Surface::getWidth((Surface *)local_88);
      local_8a4 = (fVar16 + 0.5) / (float)iVar7;
      p_Var3 = this->m_evalFunc;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&stack0xfffffffffffff750,local_8a4,(float)x)
      ;
      local_8a8 = (*p_Var3)((Vec2 *)&stack0xfffffffffffff750);
      x_1._3_1_ = compare<float>(this->m_compareFunc,local_8a8,0.55);
      iVar7 = half;
      fVar16 = d;
      if ((bool)x_1._3_1_) {
        xf_1 = (float)tcu::RGBA::green();
      }
      else {
        xf_1 = (float)tcu::RGBA::blue();
      }
      tcu::Surface::setPixel((Surface *)local_88,(int)fVar16,iVar7,(RGBA)xf_1);
    }
    for (xh = xf; fVar16 = xh, iVar7 = tcu::Surface::getWidth((Surface *)local_88),
        (int)fVar16 < iVar7; xh = (float)((int)xh + 1)) {
      fVar16 = (float)(int)xh;
      iVar7 = tcu::Surface::getWidth((Surface *)local_88);
      rd = (fVar16 + 0.5) / (float)iVar7;
      fVar16 = (float)(int)xh;
      fVar17 = (float)(int)xf;
      iVar7 = tcu::Surface::getWidth((Surface *)local_88);
      d_1 = ((fVar16 - fVar17) + 0.5) / (float)(iVar7 - (int)xf);
      local_8c8 = (d_1 + (float)x) * -0.5 + 1.0;
      p_Var3 = this->m_evalFunc;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&stack0xfffffffffffff72c,rd,(float)x);
      local_8cc = (*p_Var3)((Vec2 *)&stack0xfffffffffffff72c);
      bVar5 = compare<float>(this->m_compareFunc,local_8cc,local_8c8);
      iVar7 = half;
      fVar16 = xh;
      if (bVar5) {
        local_8dc = tcu::RGBA::green();
      }
      else {
        local_8dc = tcu::RGBA::blue();
      }
      tcu::Surface::setPixel((Surface *)local_88,(int)fVar16,iVar7,local_8dc);
    }
  }
  bVar5 = tcu::fuzzyCompare(log_00,"Result","Image comparison result",(Surface *)local_88,
                            (Surface *)&referenceFrame.m_pixels.m_cap,0.05,COMPARE_LOG_RESULT);
  if (bVar5) {
    local_b88 = "Pass";
  }
  else {
    local_b88 = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar5,local_b88);
  tcu::Surface::~Surface((Surface *)local_88);
  tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
  de::Random::~Random((Random *)&renderTarget);
  return STOP;
}

Assistant:

FragDepthCompareCase::IterateResult FragDepthCompareCase::iterate(void)
{
	TestLog&				 log = m_testCtx.getLog();
	const glw::Functions&	gl  = m_context.getRenderContext().getFunctions();
	de::Random				 rnd(deStringHash(getName()));
	const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
	int						 viewportW	= de::min(128, renderTarget.getWidth());
	int						 viewportH	= de::min(128, renderTarget.getHeight());
	int						 viewportX	= rnd.getInt(0, renderTarget.getWidth() - viewportW);
	int						 viewportY	= rnd.getInt(0, renderTarget.getHeight() - viewportH);
	tcu::Surface			 renderedFrame(viewportW, viewportH);
	tcu::Surface			 referenceFrame(viewportW, viewportH);
	const float				 constDepth = 0.1f;

	if (renderTarget.getDepthBits() == 0)
		throw tcu::NotSupportedError("Depth buffer is required", "", __FILE__, __LINE__);

	gl.viewport(viewportX, viewportY, viewportW, viewportH);
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	// Fill viewport with 2 quads - one with constant depth and another with d = [-1..1]
	{
		glu::ShaderProgram basicQuadProgram(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(s_vertexShaderSrc, m_glslVersion).c_str(),
									specializeVersion(s_defaultFragmentShaderSrc, m_glslVersion).c_str()));

		if (!basicQuadProgram.isOk())
		{
			log << basicQuadProgram;
			TCU_FAIL("Compile failed");
		}

		const float constDepthCoord[] = { -1.0f, -1.0f, constDepth, 1.0f, -1.0f, +1.0f, constDepth, 1.0f,
										  0.0f,  -1.0f, constDepth, 1.0f, 0.0f,  +1.0f, constDepth, 1.0f };
		const float varyingDepthCoord[] = { 0.0f,  -1.0f, +1.0f, 1.0f, 0.0f,  +1.0f, 0.0f,  1.0f,
											+1.0f, -1.0f, 0.0f,  1.0f, +1.0f, +1.0f, -1.0f, 1.0f };

		gl.useProgram(basicQuadProgram.getProgram());
		gl.uniform4f(gl.getUniformLocation(basicQuadProgram.getProgram(), "u_color"), 0.0f, 0.0f, 1.0f, 1.0f);
		gl.depthFunc(GL_ALWAYS);

		{
			glu::VertexArrayBinding posBinding = glu::va::Float("a_position", 4, 4, 0, &constDepthCoord[0]);
			glu::draw(m_context.getRenderContext(), basicQuadProgram.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		{
			glu::VertexArrayBinding posBinding = glu::va::Float("a_position", 4, 4, 0, &varyingDepthCoord[0]);
			glu::draw(m_context.getRenderContext(), basicQuadProgram.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw base quads");
	}

	// Render with depth test.
	{
		glu::ShaderProgram program(m_context.getRenderContext(),
								   glu::makeVtxFragSources(specializeVersion(s_vertexShaderSrc, m_glslVersion).c_str(),
														   specializeVersion(m_fragSrc, m_glslVersion).c_str()));
		log << program;

		if (!program.isOk())
			TCU_FAIL("Compile failed");

		const float coord[]	= { 0.0f, 0.0f, 0.0f, 1.0f, 1.0f, 0.0f, 1.0f, 1.0f };
		const float position[] = { -1.0f, -1.0f, +1.0f, 1.0f, -1.0f, +1.0f, 0.0f,  1.0f,
								   +1.0f, -1.0f, 0.0f,  1.0f, +1.0f, +1.0f, -1.0f, 1.0f };

		gl.useProgram(program.getProgram());
		gl.depthFunc(m_compareFunc);
		gl.uniform4f(gl.getUniformLocation(program.getProgram(), "u_color"), 0.0f, 1.0f, 0.0f, 1.0f);

		// Setup default helper uniforms.
		setupDefaultUniforms(m_context.getRenderContext(), program.getProgram());

		{
			glu::VertexArrayBinding vertexArrays[] = { glu::va::Float("a_position", 4, 4, 0, &position[0]),
													   glu::va::Float("a_coord", 2, 4, 0, &coord[0]) };
			glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
					  &vertexArrays[0], glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw test quad");
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedFrame.getAccess());

	// Render reference.
	for (int y = 0; y < referenceFrame.getHeight(); y++)
	{
		float yf   = ((float)y + 0.5f) / (float)referenceFrame.getHeight();
		int   half = de::clamp((int)((float)referenceFrame.getWidth() * 0.5f + 0.5f), 0, referenceFrame.getWidth());

		// Fill left half - comparison to constant 0.5
		for (int x = 0; x < half; x++)
		{
			float xf	= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float d		= m_evalFunc(Vec2(xf, yf));
			bool  dpass = compare(m_compareFunc, d, constDepth * 0.5f + 0.5f);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}

		// Fill right half - comparison to interpolated depth
		for (int x = half; x < referenceFrame.getWidth(); x++)
		{
			float xf	= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float xh	= ((float)x - (float)half + 0.5f) / (float)(referenceFrame.getWidth() - half);
			float rd	= 1.0f - (xh + yf) * 0.5f;
			float d		= m_evalFunc(Vec2(xf, yf));
			bool  dpass = compare(m_compareFunc, d, rd);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}
	}

	bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f,
								  tcu::COMPARE_LOG_RESULT);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}